

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O1

void testingHelp(void)

{
  puts(
      "Usage:\ttest [FLAG]... [OPTION]\n\nFlags:\t\'-map\' tests file parsing(defaults to cwd, optional absolute path as arg)\n\t\'-unit\' tests unit creation and deletion"
      );
  return;
}

Assistant:

void testingHelp() {
    printf(
        "Usage:\ttest [FLAG]... [OPTION]\n\n"
            "Flags:"
            "\t'-map' tests file parsing"
            "(defaults to cwd, optional absolute path as arg)\n"
            "\t'-unit' tests unit creation and deletion\n"
    );
}